

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
mvm::test::test_instr_set::randn
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          test_instr_set *this,ui32 n)

{
  ulong __n;
  allocator<unsigned_int> local_25;
  value_type_conflict3 local_24 [2];
  uint local_1c;
  test_instr_set *ptStack_18;
  ui32 n_local;
  test_instr_set *this_local;
  
  local_24[1] = 4;
  local_1c = n;
  ptStack_18 = this;
  this_local = (test_instr_set *)__return_storage_ptr__;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->call_stack,local_24 + 1);
  __n = (ulong)local_1c;
  local_24[0] = 1;
  std::allocator<unsigned_int>::allocator(&local_25);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,__n,local_24,&local_25);
  std::allocator<unsigned_int>::~allocator(&local_25);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ui32> randn(ui32 n) {
    call_stack.push_back(4);
    return std::vector<ui32>(n, 1);
  }